

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2BitstateCaptureBug(void)

{
  bool bVar1;
  StringPiece s;
  Options opt;
  RE2 re;
  StringPiece local_290;
  Options local_280;
  RE2 local_268;
  LogMessage local_188;
  
  local_280.encoding_ = EncodingUTF8;
  local_280.posix_syntax_ = false;
  local_280.longest_match_ = false;
  local_280.log_errors_ = true;
  local_280.literal_ = false;
  local_280.never_nl_ = false;
  local_280.dot_nl_ = false;
  local_280.never_capture_ = false;
  local_280.case_sensitive_ = true;
  local_280.perl_classes_ = false;
  local_280.word_boundary_ = false;
  local_280.one_line_ = false;
  local_280.max_mem_ = 20000;
  local_188._0_8_ = "(_________$)";
  local_188._8_4_ = 0xc;
  RE2::RE2(&local_268,(StringPiece *)&local_188,&local_280);
  local_290.ptr_ = "xxxxxxxxxxxxxxxxxxxxxxxxxx_________x";
  local_290.length_ = 0x24;
  bVar1 = RE2::Match(&local_268,&local_290,0,0x24,UNANCHORED,(StringPiece *)0x0,0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x549,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_188 + 8),
               "Check failed: !(re.Match(s, 0, s.size(), RE2::UNANCHORED, __null, 0))",0x45);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  RE2::~RE2(&local_268);
  return;
}

Assistant:

TEST(RE2, BitstateCaptureBug) {
  RE2::Options opt;
  opt.set_max_mem(20000);
  RE2 re("(_________$)", opt);
  StringPiece s = "xxxxxxxxxxxxxxxxxxxxxxxxxx_________x";
  EXPECT_FALSE(re.Match(s, 0, s.size(), RE2::UNANCHORED, NULL, 0));
}